

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O2

void __thiscall DConversationMenu::Drawer(DConversationMenu *this)

{
  FTextureID texnum;
  FStrifeDialogueNode *pFVar1;
  int *piVar2;
  DFrameBuffer *this_00;
  int iVar3;
  int iVar4;
  FTexture *img;
  char *string;
  AActor *this_01;
  FBrokenLines *pFVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 uVar14;
  ulong in_stack_ffffffffffffff88;
  char tbuf [16];
  
  this_00 = screen;
  uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  if (this->mDialogueLines == (FBrokenLines *)0x0) {
    __assert_fail("mDialogueLines != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_conversation.cpp"
                  ,0x3d8,"virtual void DConversationMenu::Drawer()");
  }
  pFVar1 = this->mCurNode;
  if (pFVar1 != (FStrifeDialogueNode *)0x0) {
    if (((ConversationPauseTic < gametic) && (!multiplayer)) && ((level.flags2._2_1_ & 0x10) == 0))
    {
      menuactive = MENU_On;
    }
    lVar10 = (long)consoleplayer;
    texnum.texnum = (pFVar1->Backdrop).texnum;
    if (0 < texnum.texnum) {
      img = FTextureManager::operator()(&TexMan,texnum,false);
      DCanvas::DrawTexture((DCanvas *)this_00,img,0.0,0.0,0x40001391,1,0);
    }
    iVar9 = CleanYfac;
    iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    uVar12 = (long)((screen->super_DSimpleCanvas).super_DCanvas.Height << 4) / 200;
    uVar11 = uVar12 & 0xffffffff;
    string = pFVar1->SpeakerName;
    if (string == (char *)0x0) {
      this_01 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc200 + lVar10 * 0x2a0));
      string = AActor::GetTag(this_01,"Person");
    }
    else if (*string == '$') {
      string = FStringTable::operator()(&GStrings,string + 1);
    }
    if ((pFVar1->Backdrop).texnum < 1) {
      pFVar5 = this->mDialogueLines;
      iVar8 = iVar9 * -10;
      do {
        iVar8 = iVar8 + iVar9 * 10;
        piVar2 = &pFVar5->Width;
        pFVar5 = pFVar5 + 1;
      } while (-1 < *piVar2);
      iVar3 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar7 = iVar3 * 0xe;
      if (string != (char *)0x0) {
        iVar8 = (iVar9 * 0x1e >> 1) + iVar8;
      }
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3ee66666,screen,0,(long)iVar7 / 0x140 & 0xffffffff,
                 (long)((screen->super_DSimpleCanvas).super_DCanvas.Height * 0xd) / 200 & 0xffffffff
                 ,(ulong)(uint)(iVar7 / -0x140 + (iVar3 * 0x134) / 0x140),
                 (ulong)(uint)(CleanYfac * 6 + iVar8));
    }
    iVar3 = OptionSettings.mLinespacing * (this->mResponseLines).Count + 4;
    iVar8 = 200 - this->mYpos;
    if (iVar3 < iVar8) {
      iVar8 = iVar3;
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
              (0x3ee66666,screen,0,
               (ulong)(uint)(CleanXfac * -0x88 +
                            (screen->super_DSimpleCanvas).super_DCanvas.Width / 2),
               (ulong)(uint)((this->mYpos + -0x66) * CleanYfac +
                            (screen->super_DSimpleCanvas).super_DCanvas.Height / 2),
               (ulong)(uint)(CleanXfac * 0x110),(ulong)(uint)(iVar8 * CleanYfac));
    if (string != (char *)0x0) {
      iVar8 = (int)uVar12;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,9,iVar6 / 0x14,iVar8,string,0x40001393,
                        CONCAT44(uVar14,1),in_stack_ffffffffffffff88 & 0xffffffff00000000);
      uVar11 = (ulong)(uint)(iVar8 + (iVar9 * 0x1e >> 1));
    }
    iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    for (lVar10 = 8; iVar8 = OptionSettings.mLinespacing,
        -1 < *(int *)((long)this->mDialogueLines + lVar10 + -8); lVar10 = lVar10 + 0x10) {
      DCanvas::DrawText((DCanvas *)screen,SmallFont,0xb,(iVar6 * 0x18) / 0x140,(int)uVar11,
                        *(char **)((long)&this->mDialogueLines->Width + lVar10),0x40001393,1,0);
      uVar11 = (ulong)(uint)((int)uVar11 + iVar9 * 10);
    }
    iVar6 = this->mYpos;
    iVar3 = OptionSettings.mLinespacing / 2;
    lVar10 = 0;
    iVar9 = 0;
    for (uVar12 = 0; uVar12 < (this->mResponseLines).Count; uVar12 = uVar12 + 1) {
      FFont::StringWidth(SmallFont,
                         (FString *)((long)&((this->mResponseLines).Array)->Chars + lVar10));
      DCanvas::DrawText((DCanvas *)screen,SmallFont,3,0x40,iVar6,
                        *(char **)((long)&((this->mResponseLines).Array)->Chars + lVar10),0x40001390
                        ,1,0);
      if (uVar12 == (this->mResponses).Array[iVar9]) {
        iVar7 = iVar9 + 1;
        mysnprintf(tbuf,0x10,"%d.");
        iVar4 = FFont::StringWidth(SmallFont,(BYTE *)tbuf);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,2,0x32 - iVar4,iVar6,tbuf,0x40001390,1,0);
        bVar13 = iVar9 == mSelection;
        iVar9 = iVar7;
        if (bVar13) {
          DCanvas::DrawText((DCanvas *)screen,ConFont,
                            (uint)((DConversationMenu *)DMenu::CurrentMenu != this ||
                                  DMenu::MenuTime % 8 < 4) * 4 + 2,
                            CleanXfac * -0x6b +
                            (screen->super_DSimpleCanvas).super_DCanvas.Width / 2,
                            (iVar3 + -0x69 + iVar6) * CleanYfac +
                            (screen->super_DSimpleCanvas).super_DCanvas.Height / 2,"\r",0x400013b8,
                            (ulong)(uint)(CleanXfac << 3),0x400013b9,(ulong)(uint)(CleanYfac << 3),0
                           );
        }
      }
      iVar6 = iVar6 + iVar8;
      lVar10 = lVar10 + 8;
    }
    return;
  }
  __assert_fail("mCurNode != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_conversation.cpp"
                ,0x3d9,"virtual void DConversationMenu::Drawer()");
}

Assistant:

void Drawer()
	{
		const char *speakerName;
		int x, y, linesize;
		int width, fontheight;

		player_t *cp = &players[consoleplayer];

		assert (mDialogueLines != NULL);
		assert (mCurNode != NULL);

		FStrifeDialogueNode *CurNode = mCurNode;

		if (CurNode == NULL)
		{
			Close ();
			return;
		}

		// [CW] Freeze the game depending on MAPINFO options.
		if (ConversationPauseTic < gametic && !multiplayer && !(level.flags2 & LEVEL2_CONV_SINGLE_UNFREEZE))
		{
			menuactive = MENU_On;
		}

		if (CurNode->Backdrop.isValid())
		{
			screen->DrawTexture (TexMan(CurNode->Backdrop), 0, 0, DTA_320x200, true, TAG_DONE);
		}
		x = 16 * screen->GetWidth() / 320;
		y = 16 * screen->GetHeight() / 200;
		linesize = 10 * CleanYfac;

		// Who is talking to you?
		if (CurNode->SpeakerName != NULL)
		{
			speakerName = CurNode->SpeakerName;
			if (speakerName[0] == '$') speakerName = GStrings(speakerName+1);
		}
		else
		{
			speakerName = cp->ConversationNPC->GetTag("Person");
		}

		// Dim the screen behind the dialogue (but only if there is no backdrop).
		if (!CurNode->Backdrop.isValid())
		{
			int i;
			for (i = 0; mDialogueLines[i].Width >= 0; ++i)
			{ }
			screen->Dim (0, 0.45f, 14 * screen->GetWidth() / 320, 13 * screen->GetHeight() / 200,
				308 * screen->GetWidth() / 320 - 14 * screen->GetWidth () / 320,
				speakerName == NULL ? linesize * i + 6 * CleanYfac
				: linesize * i + 6 * CleanYfac + linesize * 3/2);
		}

		// Dim the screen behind the PC's choices.

		screen->Dim (0, 0.45f, (24-160) * CleanXfac + screen->GetWidth()/2,
			(mYpos - 2 - 100) * CleanYfac + screen->GetHeight()/2,
			272 * CleanXfac,
			MIN<int>(mResponseLines.Size() * OptionSettings.mLinespacing + 4, 200 - mYpos) * CleanYfac);

		if (speakerName != NULL)
		{
			screen->DrawText (SmallFont, CR_WHITE, x, y, speakerName,
				DTA_CleanNoMove, true, TAG_DONE);
			y += linesize * 3 / 2;
		}
		x = 24 * screen->GetWidth() / 320;
		for (int i = 0; mDialogueLines[i].Width >= 0; ++i)
		{
			screen->DrawText (SmallFont, CR_UNTRANSLATED, x, y, mDialogueLines[i].Text,
				DTA_CleanNoMove, true, TAG_DONE);
			y += linesize;
		}

		if (ShowGold)
		{
			auto cointype = PClass::FindActor("Coin");
			if (cointype)
			{
				AInventory *coin = cp->ConversationPC->FindInventory(cointype);
				char goldstr[32];

				mysnprintf(goldstr, countof(goldstr), "%d", coin != NULL ? coin->Amount : 0);
				screen->DrawText(SmallFont, CR_GRAY, 21, 191, goldstr, DTA_320x200, true,
					DTA_FillColor, 0, DTA_AlphaF, HR_SHADOW, TAG_DONE);
				screen->DrawTexture(TexMan(((AInventory *)GetDefaultByType(cointype))->Icon),
					3, 190, DTA_320x200, true,
					DTA_FillColor, 0, DTA_AlphaF, HR_SHADOW, TAG_DONE);
				screen->DrawText(SmallFont, CR_GRAY, 20, 190, goldstr, DTA_320x200, true, TAG_DONE);
				screen->DrawTexture(TexMan(((AInventory *)GetDefaultByType(cointype))->Icon),
					2, 189, DTA_320x200, true, TAG_DONE);
			}
		}

		y = mYpos;
		fontheight = OptionSettings.mLinespacing;

		int response = 0;
		for (unsigned i = 0; i < mResponseLines.Size(); i++, y += fontheight)
		{
			width = SmallFont->StringWidth(mResponseLines[i]);
			x = 64;

			screen->DrawText (SmallFont, CR_GREEN, x, y, mResponseLines[i], DTA_Clean, true, TAG_DONE);

			if (i == mResponses[response])
			{
				char tbuf[16];

				response++;
				mysnprintf (tbuf, countof(tbuf), "%d.", response);
				x = 50 - SmallFont->StringWidth (tbuf);
				screen->DrawText (SmallFont, CR_GREY, x, y, tbuf, DTA_Clean, true, TAG_DONE);

				if (response == mSelection+1)
				{
					int color = ((DMenu::MenuTime%8) < 4) || DMenu::CurrentMenu != this ? CR_RED:CR_GREY;

					x = (50 + 3 - 160) * CleanXfac + screen->GetWidth() / 2;
					int yy = (y + fontheight/2 - 5 - 100) * CleanYfac + screen->GetHeight() / 2;
					screen->DrawText (ConFont, color, x, yy, "\xd",
						DTA_CellX, 8 * CleanXfac,
						DTA_CellY, 8 * CleanYfac,
						TAG_DONE);
				}
			}
		}
	}